

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
UnsignedLongsEqualFailure::UnsignedLongsEqualFailure
          (UnsignedLongsEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          unsigned_long expected,unsigned_long actual,SimpleString *text)

{
  SimpleString *in_RDI;
  SimpleString expectedReported;
  SimpleString actualReported;
  SimpleString eDecimal;
  SimpleString aDecimal;
  SimpleString *in_stack_ffffffffffffff00;
  SimpleString *in_stack_ffffffffffffff08;
  SimpleString *in_stack_ffffffffffffff10;
  TestFailure *in_stack_ffffffffffffff18;
  SimpleString *in_stack_ffffffffffffff20;
  SimpleString *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  char in_stack_ffffffffffffff47;
  TestFailure *in_stack_ffffffffffffff48;
  TestFailure *in_stack_ffffffffffffff50;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffff50,(UtestShell *)in_stack_ffffffffffffff48,
             (char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  in_RDI->buffer_ = (char *)&PTR__UnsignedLongsEqualFailure_001c3af0;
  TestFailure::createUserText
            (in_stack_ffffffffffffff48,
             (SimpleString *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  SimpleString::operator=(in_stack_ffffffffffffff00,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17a951);
  StringFrom((unsigned_long)in_RDI);
  StringFrom((unsigned_long)in_RDI);
  SimpleString::padStringsToSameLength
            ((SimpleString *)in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff47);
  SimpleString::SimpleString(in_stack_ffffffffffffff00,(char *)in_RDI);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  BracketsFormattedHexStringFrom((unsigned_long)in_stack_ffffffffffffff28);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  SimpleString::~SimpleString((SimpleString *)0x17a9fe);
  SimpleString::~SimpleString((SimpleString *)0x17aa08);
  SimpleString::~SimpleString((SimpleString *)0x17aa12);
  SimpleString::SimpleString(in_stack_ffffffffffffff00,(char *)in_RDI);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  BracketsFormattedHexStringFrom((unsigned_long)in_stack_ffffffffffffff28);
  SimpleString::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  SimpleString::~SimpleString((SimpleString *)0x17aa72);
  SimpleString::~SimpleString((SimpleString *)0x17aa7c);
  SimpleString::~SimpleString((SimpleString *)0x17aa86);
  TestFailure::createButWasString
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  SimpleString::operator+=(in_stack_ffffffffffffff00,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17aac1);
  SimpleString::~SimpleString((SimpleString *)0x17aacb);
  SimpleString::~SimpleString((SimpleString *)0x17aad8);
  SimpleString::~SimpleString((SimpleString *)0x17aae5);
  SimpleString::~SimpleString((SimpleString *)0x17aaf2);
  return;
}

Assistant:

UnsignedLongsEqualFailure::UnsignedLongsEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, unsigned long expected, unsigned long actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom(actual);
    SimpleString eDecimal = StringFrom(expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');

    SimpleString actualReported = aDecimal + " " + BracketsFormattedHexStringFrom(actual);
    SimpleString expectedReported = eDecimal + " " + BracketsFormattedHexStringFrom(expected);

    message_ += createButWasString(expectedReported, actualReported);
}